

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::DataSink::~DataSink(DataSink *this)

{
  std::streambuf::~streambuf(&this->sb_);
  std::ios_base::~ios_base((ios_base *)&this->field_0x68);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&this->is_writable);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&this->done);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)this);
  return;
}

Assistant:

DataSink() : os(&sb_), sb_(*this) {}